

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void recff_ffi_string(jit_State *J,RecordFFData *rd)

{
  IRRef1 IVar1;
  TRef TVar2;
  TRef TVar3;
  jit_State *J_00;
  jit_State *in_RSI;
  jit_State *in_RDI;
  TRef trlen;
  TRef tr;
  CTState *cts;
  TRef in_stack_00000028;
  TRef in_stack_0000002c;
  CType *in_stack_00000030;
  jit_State *in_stack_00000038;
  TValue *in_stack_ffffffffffffff88;
  IRRef1 local_70;
  
  J_00 = (jit_State *)(ulong)in_RDI[-1].bpropcache[0xc].mode;
  if (*in_RDI->base != 0) {
    if ((in_RDI->base[1] & 0x1f000000) == 0) {
      TVar2 = crec_ct_tv(in_stack_00000038,in_stack_00000030,in_stack_0000002c,in_stack_00000028,
                         (cTValue *)J);
      TVar3 = lj_ir_call(in_RDI,IRCALL_strlen,(ulong)TVar2);
      local_70 = (IRRef1)TVar3;
      IVar1 = (IRRef1)TVar2;
    }
    else {
      TVar2 = crec_toint(in_RSI,(CTState *)J_00,*in_RDI->base,in_stack_ffffffffffffff88);
      local_70 = (IRRef1)TVar2;
      TVar2 = crec_ct_tv(in_stack_00000038,in_stack_00000030,in_stack_0000002c,in_stack_00000028,
                         (cTValue *)J);
      IVar1 = (IRRef1)TVar2;
    }
    (in_RDI->fold).ins.field_0.ot = 0x4e04;
    (in_RDI->fold).ins.field_0.op1 = IVar1;
    (in_RDI->fold).ins.field_0.op2 = local_70;
    TVar2 = lj_opt_fold(J_00);
    *in_RDI->base = TVar2;
  }
  return;
}

Assistant:

void LJ_FASTCALL recff_ffi_string(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  TRef tr = J->base[0];
  if (tr) {
    TRef trlen = J->base[1];
    if (!tref_isnil(trlen)) {
      trlen = crec_toint(J, cts, trlen, &rd->argv[1]);
      tr = crec_ct_tv(J, ctype_get(cts, CTID_P_CVOID), 0, tr, &rd->argv[0]);
    } else {
      tr = crec_ct_tv(J, ctype_get(cts, CTID_P_CCHAR), 0, tr, &rd->argv[0]);
      trlen = lj_ir_call(J, IRCALL_strlen, tr);
    }
    J->base[0] = emitir(IRT(IR_XSNEW, IRT_STR), tr, trlen);
  }  /* else: interpreter will throw. */
}